

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode Curl_ftpsendf(connectdata *conn,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined1 local_458 [8];
  va_list ap;
  size_t *psStack_438;
  CURLcode result;
  char *sptr;
  size_t write_len;
  char s [1024];
  ssize_t bytes_written;
  char *fmt_local;
  connectdata *conn_local;
  
  if (in_AL != '\0') {
    local_4d8 = in_XMM0_Qa;
    local_4c8 = in_XMM1_Qa;
    local_4b8 = in_XMM2_Qa;
    local_4a8 = in_XMM3_Qa;
    local_498 = in_XMM4_Qa;
    local_488 = in_XMM5_Qa;
    local_478 = in_XMM6_Qa;
    local_468 = in_XMM7_Qa;
  }
  psStack_438 = &write_len;
  ap[0].reg_save_area._4_4_ = 0;
  ap[0].overflow_arg_area = local_508;
  ap[0]._0_8_ = &stack0x00000008;
  local_458._4_4_ = 0x30;
  local_458._0_4_ = 0x10;
  local_4f8 = in_RDX;
  local_4f0 = in_RCX;
  local_4e8 = in_R8;
  local_4e0 = in_R9;
  iVar1 = curl_mvsnprintf((char *)&write_len,0x3fd,fmt,(__va_list_tag *)local_458);
  strcpy(s + (long)iVar1 + -8,"\r\n");
  sptr = (char *)((long)iVar1 + 2);
  s[0x3f8] = '\0';
  s[0x3f9] = '\0';
  s[0x3fa] = '\0';
  s[0x3fb] = '\0';
  s[0x3fc] = '\0';
  s[0x3fd] = '\0';
  s[0x3fe] = '\0';
  s[0x3ff] = '\0';
  ap[0].reg_save_area._4_4_ = CURLE_OK;
  while( true ) {
    ap[0].reg_save_area._4_4_ =
         Curl_write(conn,conn->sock[0],psStack_438,(size_t)sptr,(ssize_t *)(s + 0x3f8));
    if (ap[0].reg_save_area._4_4_ != CURLE_OK) {
      return ap[0].reg_save_area._4_4_;
    }
    if (((conn->data->set).verbose & 1U) != 0) {
      Curl_debug(conn->data,CURLINFO_HEADER_OUT,(char *)psStack_438,s._1016_8_,conn);
    }
    if ((char *)s._1016_8_ == sptr) break;
    sptr = sptr + -s._1016_8_;
    psStack_438 = (size_t *)(s._1016_8_ + (long)psStack_438);
  }
  return ap[0].reg_save_area._4_4_;
}

Assistant:

CURLcode Curl_ftpsendf(struct connectdata *conn,
                       const char *fmt, ...)
{
  ssize_t bytes_written;
#define SBUF_SIZE 1024
  char s[SBUF_SIZE];
  size_t write_len;
  char *sptr=s;
  CURLcode result = CURLE_OK;
#ifdef HAVE_GSSAPI
  enum protection_level data_sec = conn->data_prot;
#endif

  va_list ap;
  va_start(ap, fmt);
  write_len = vsnprintf(s, SBUF_SIZE-3, fmt, ap);
  va_end(ap);

  strcpy(&s[write_len], "\r\n"); /* append a trailing CRLF */
  write_len +=2;

  bytes_written=0;

  result = Curl_convert_to_network(conn->data, s, write_len);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result)
    return result;

  for(;;) {
#ifdef HAVE_GSSAPI
    conn->data_prot = PROT_CMD;
#endif
    result = Curl_write(conn, conn->sock[FIRSTSOCKET], sptr, write_len,
                        &bytes_written);
#ifdef HAVE_GSSAPI
    DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
    conn->data_prot = data_sec;
#endif

    if(result)
      break;

    if(conn->data->set.verbose)
      Curl_debug(conn->data, CURLINFO_HEADER_OUT,
                 sptr, (size_t)bytes_written, conn);

    if(bytes_written != (ssize_t)write_len) {
      write_len -= bytes_written;
      sptr += bytes_written;
    }
    else
      break;
  }

  return result;
}